

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeFeaturesSection(WasmBinaryWriter *this)

{
  BufferWithRandomAccess *this_00;
  anon_class_16_2_1cd62e68 f_00;
  bool bVar1;
  size_type sVar2;
  string_view local_98;
  reference local_88;
  char **f;
  iterator __end1;
  iterator __begin1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  string_view local_60;
  int32_t local_50;
  int32_t start;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_40;
  anon_class_1_0_00000001 *local_38;
  undefined1 local_30 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> features;
  anon_class_1_0_00000001 toString;
  WasmBinaryWriter *this_local;
  
  if (((this->wasm->hasFeaturesSection & 1U) != 0) &&
     (bVar1 = FeatureSet::isMVP(&this->wasm->features), !bVar1)) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
    local_38 = (anon_class_1_0_00000001 *)
               ((long)&features.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    f_00.toString = local_38;
    f_00.features = (vector<const_char_*,_std::allocator<const_char_*>_> *)local_30;
    local_40 = (vector<const_char_*,_std::allocator<const_char_*>_> *)local_30;
    FeatureSet::iterFeatures<wasm::WasmBinaryWriter::writeFeaturesSection()::__0>
              (&this->wasm->features,f_00);
    local_50 = startSection<wasm::BinaryConsts::Section>(this,Custom);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_60,BinaryConsts::CustomSections::TargetFeatures);
    writeInlineString(this,local_60);
    this_00 = this->o;
    sVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
    LEB<unsigned_int,_unsigned_char>::LEB
              ((LEB<unsigned_int,_unsigned_char> *)((long)&__range1 + 4),(uint)sVar2);
    BufferWithRandomAccess::operator<<(this_00,__range1._4_4_);
    __end1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                       ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
    f = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                           ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                       *)&f), bVar1) {
      local_88 = __gnu_cxx::
                 __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                 ::operator*(&__end1);
      BufferWithRandomAccess::operator<<(this->o,'+');
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,*local_88);
      writeInlineString(this,local_98);
      __gnu_cxx::
      __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
      operator++(&__end1);
    }
    finishSection(this,local_50);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeFeaturesSection() {
  if (!wasm->hasFeaturesSection || wasm->features.isMVP()) {
    return;
  }

  // TODO(tlively): unify feature names with rest of toolchain and use
  // FeatureSet::toString()
  auto toString = [](FeatureSet::Feature f) {
    switch (f) {
      case FeatureSet::Atomics:
        return BinaryConsts::CustomSections::AtomicsFeature;
      case FeatureSet::MutableGlobals:
        return BinaryConsts::CustomSections::MutableGlobalsFeature;
      case FeatureSet::TruncSat:
        return BinaryConsts::CustomSections::TruncSatFeature;
      case FeatureSet::SIMD:
        return BinaryConsts::CustomSections::SIMD128Feature;
      case FeatureSet::BulkMemory:
        return BinaryConsts::CustomSections::BulkMemoryFeature;
      case FeatureSet::SignExt:
        return BinaryConsts::CustomSections::SignExtFeature;
      case FeatureSet::ExceptionHandling:
        return BinaryConsts::CustomSections::ExceptionHandlingFeature;
      case FeatureSet::TailCall:
        return BinaryConsts::CustomSections::TailCallFeature;
      case FeatureSet::ReferenceTypes:
        return BinaryConsts::CustomSections::ReferenceTypesFeature;
      case FeatureSet::Multivalue:
        return BinaryConsts::CustomSections::MultivalueFeature;
      case FeatureSet::GC:
        return BinaryConsts::CustomSections::GCFeature;
      case FeatureSet::Memory64:
        return BinaryConsts::CustomSections::Memory64Feature;
      case FeatureSet::RelaxedSIMD:
        return BinaryConsts::CustomSections::RelaxedSIMDFeature;
      case FeatureSet::ExtendedConst:
        return BinaryConsts::CustomSections::ExtendedConstFeature;
      case FeatureSet::Strings:
        return BinaryConsts::CustomSections::StringsFeature;
      case FeatureSet::MultiMemory:
        return BinaryConsts::CustomSections::MultiMemoryFeature;
      case FeatureSet::StackSwitching:
        return BinaryConsts::CustomSections::StackSwitchingFeature;
      case FeatureSet::SharedEverything:
        return BinaryConsts::CustomSections::SharedEverythingFeature;
      case FeatureSet::FP16:
        return BinaryConsts::CustomSections::FP16Feature;
      case FeatureSet::BulkMemoryOpt:
        return BinaryConsts::CustomSections::BulkMemoryOptFeature;
      case FeatureSet::CallIndirectOverlong:
        return BinaryConsts::CustomSections::CallIndirectOverlongFeature;
      case FeatureSet::CustomDescriptors:
        return BinaryConsts::CustomSections::CustomDescriptorsFeature;
      case FeatureSet::None:
      case FeatureSet::Default:
      case FeatureSet::All:
        break;
    }
    WASM_UNREACHABLE("unexpected feature flag");
  };

  std::vector<const char*> features;
  wasm->features.iterFeatures(
    [&](FeatureSet::Feature f) { features.push_back(toString(f)); });

  auto start = startSection(BinaryConsts::Custom);
  writeInlineString(BinaryConsts::CustomSections::TargetFeatures);
  o << U32LEB(features.size());
  for (auto& f : features) {
    o << uint8_t(BinaryConsts::FeatureUsed);
    writeInlineString(f);
  }
  finishSection(start);
}